

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_36::PopulateFastFields
               (optional<unsigned_int> end_group_tag,
               vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
               *field_entries,MessageOptions *message_options,
               Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields,
               Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo> result,
               uint32_t *important_fields)

{
  Field *this;
  value_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  uint *puVar4;
  value_type *pvVar5;
  size_type sVar6;
  NonField *pNVar7;
  uint8_t local_dc;
  undefined1 local_b9;
  undefined1 local_a8 [4];
  float kMinPresence;
  enable_if_t<is_constructible_v<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field>_&&___exactly_once<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field>,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field_&>
  local_90;
  Field *fast_field;
  Field *as_field;
  FastFieldInfo *info_1;
  uint32_t fast_idx_1;
  uint32_t tag_1;
  FieldDescriptor *field;
  FieldOptions *options;
  value_type *entry;
  size_t i;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *local_48;
  FastFieldInfo *info;
  uint32_t fast_idx;
  uint32_t tag;
  uint32_t *important_fields_local;
  MessageOptions *message_options_local;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *field_entries_local;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_local;
  optional<unsigned_int> end_group_tag_local;
  
  fields_local.ptr_ = (pointer)fields.len_;
  field_entries_local =
       (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
        *)fields.ptr_;
  _fast_idx = important_fields;
  important_fields_local = (uint32_t *)message_options;
  message_options_local = (MessageOptions *)field_entries;
  fields_local.len_ =
       (size_type)
       end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&fields_local.len_);
  if ((bVar2) &&
     (puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&fields_local.len_),
     *puVar4 >> 0xe == 0)) {
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&fields_local.len_);
    uVar3 = TcParseTableBase::RecodeTagForFastParsing(*puVar4);
    info._4_4_ = uVar3;
    sVar6 = absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>::
            size(&result);
    info._0_4_ = TcParseTableBase::TagToIdx(uVar3,(uint32_t)sVar6);
    local_48 = (variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                *)absl::lts_20250127::
                  Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>::operator[]
                            (&result,(ulong)(uint32_t)info);
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&fields_local.len_);
    local_b9 = 0x73;
    if (0x7f < *puVar4) {
      local_b9 = 0x74;
    }
    i._2_1_ = local_b9;
    i._4_2_ = (undefined2)info._4_4_;
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&fields_local.len_);
    i._6_2_ = (undefined2)*puVar4;
    std::
    variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
    ::operator=(local_48,(NonField *)((long)&i + 2));
    *_fast_idx = 1 << ((byte)(uint32_t)info & 0x1f) | *_fast_idx;
  }
  for (entry = (value_type *)0x0; pvVar1 = entry,
      pvVar5 = (value_type *)
               std::
               vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
               ::size((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                       *)message_options_local), pvVar1 < pvVar5;
      entry = (value_type *)((long)&entry->field + 1)) {
    options = (FieldOptions *)
              std::
              vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ::operator[]((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                            *)message_options_local,(size_type)entry);
    field = (FieldDescriptor *)
            absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                       &field_entries_local,(size_type)entry);
    bVar2 = IsFieldEligibleForFastParsing
                      ((FieldEntryInfo *)options,(FieldOptions *)field,
                       (MessageOptions *)important_fields_local);
    if (bVar2) {
      _fast_idx_1 = options->field;
      uVar3 = GetRecodedTagForFastParsing(_fast_idx_1);
      info_1._4_4_ = uVar3;
      sVar6 = absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>
              ::size(&result);
      info_1._0_4_ = TcParseTableBase::TagToIdx(uVar3,(uint32_t)sVar6);
      as_field = (Field *)absl::lts_20250127::
                          Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>::
                          operator[](&result,(ulong)(uint32_t)info_1);
      pNVar7 = TailCallTableInfo::FastFieldInfo::AsNonField((FastFieldInfo *)as_field);
      if ((pNVar7 == (NonField *)0x0) &&
         ((fast_field = TailCallTableInfo::FastFieldInfo::AsField((FastFieldInfo *)as_field),
          this = as_field, fast_field == (Field *)0x0 ||
          (fast_field->presence_probability < *(float *)((long)&(field->all_names_).payload_ + 4))))
         ) {
        MakeFastFieldEntry((Field *)local_a8,(FieldEntryInfo *)options,(FieldOptions *)field,
                           (MessageOptions *)important_fields_local);
        local_90 = std::
                   variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   ::
                   emplace<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field>
                             ((variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                               *)this,(Field *)local_a8);
        local_90->field = _fast_idx_1;
        local_90->coded_tag = (uint16_t)info_1._4_4_;
        if (options->has_bit_index < 0) {
          local_dc = '?';
        }
        else {
          local_dc = (uint8_t)options->has_bit_index;
        }
        local_90->hasbit_idx = local_dc;
        *_fast_idx = (uint)(0.05 <= *(float *)((long)&(field->all_names_).payload_ + 4)) <<
                     ((byte)(uint32_t)info_1 & 0x1f) | *_fast_idx;
      }
    }
  }
  return;
}

Assistant:

void PopulateFastFields(
    absl::optional<uint32_t> end_group_tag,
    const std::vector<TailCallTableInfo::FieldEntryInfo>& field_entries,
    const TailCallTableInfo::MessageOptions& message_options,
    absl::Span<const TailCallTableInfo::FieldOptions> fields,
    absl::Span<TailCallTableInfo::FastFieldInfo> result,
    uint32_t& important_fields) {
  if (end_group_tag.has_value() && (*end_group_tag >> 14) == 0) {
    // Fits in 1 or 2 varint bytes.
    const uint32_t tag =
        TcParseTableBase::RecodeTagForFastParsing(*end_group_tag);
    const uint32_t fast_idx = TcParseTableBase::TagToIdx(tag, result.size());

    TailCallTableInfo::FastFieldInfo& info = result[fast_idx];
    info.data = TailCallTableInfo::FastFieldInfo::NonField{
        *end_group_tag < 128 ? TcParseFunction::kFastEndG1
                             : TcParseFunction::kFastEndG2,
        static_cast<uint16_t>(tag),
        static_cast<uint16_t>(*end_group_tag),
    };
    important_fields |= uint32_t{1} << fast_idx;
  }

  for (size_t i = 0; i < field_entries.size(); ++i) {
    const auto& entry = field_entries[i];
    const auto& options = fields[i];
    if (!IsFieldEligibleForFastParsing(entry, options, message_options)) {
      continue;
    }

    const auto* field = entry.field;
    const uint32_t tag = GetRecodedTagForFastParsing(field);
    const uint32_t fast_idx = TcParseTableBase::TagToIdx(tag, result.size());

    TailCallTableInfo::FastFieldInfo& info = result[fast_idx];
    if (info.AsNonField() != nullptr) {
      // Right now non-field means END_GROUP which is guaranteed to be present.
      continue;
    }
    if (auto* as_field = info.AsField()) {
      // This field entry is already filled. Skip if previous entry is more
      // likely present.
      if (as_field->presence_probability >= options.presence_probability) {
        continue;
      }
    }

    // We reset the entry even if it had a field already.
    // Fill in this field's entry:
    auto& fast_field =
        info.data.emplace<TailCallTableInfo::FastFieldInfo::Field>(
            MakeFastFieldEntry(entry, options, message_options));
    fast_field.field = field;
    fast_field.coded_tag = tag;
    // If this field does not have presence, then it can set an out-of-bounds
    // bit (tailcall parsing uses a uint64_t for hasbits, but only stores 32).
    fast_field.hasbit_idx = entry.hasbit_idx >= 0 ? entry.hasbit_idx : 63;
    // 0.05 was selected based on load tests where 0.1 and 0.01 were also
    // evaluated and worse.
    constexpr float kMinPresence = 0.05f;
    important_fields |= uint32_t{options.presence_probability >= kMinPresence}
                        << fast_idx;
  }
}